

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseFailureIncludesCheckExpectedAndActual::RunImpl
          (TestCheckCloseFailureIncludesCheckExpectedAndActual *this)

{
  TestResults *pTVar1;
  bool bVar2;
  char *pcVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_8f0 [2];
  TestDetails local_8b0;
  TestDetails local_890;
  float local_870;
  float local_86c;
  float local_868;
  float actual;
  float expected;
  undefined1 local_858 [8];
  TestResults results;
  RecordingReporter reporter;
  TestCheckCloseFailureIncludesCheckExpectedAndActual *this_local;
  
  reporter._2088_8_ = this;
  RecordingReporter::RecordingReporter((RecordingReporter *)&results.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_858,(TestReporter *)&results.m_failureCount);
  local_868 = 0.9;
  local_86c = 1.1;
  local_870 = 0.01;
  UnitTest::TestDetails::TestDetails(&local_890,"","","",0);
  UnitTest::CheckClose<float,float,float>
            ((TestResults *)local_858,&local_868,&local_86c,&local_870,&local_890);
  pcVar3 = strstr(reporter.lastFailedTest + 0xf8,"xpected 0.9");
  bVar2 = UnitTest::Check<char*>(pcVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar5,0x9b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_8b0,"strstr(reporter.lastFailedMessage, \"xpected 0.9\")");
  }
  pcVar3 = strstr(reporter.lastFailedTest + 0xf8,"was 1.1");
  bVar2 = UnitTest::Check<char*>(pcVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8f0,*ppTVar5,0x9c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_8f0,"strstr(reporter.lastFailedMessage, \"was 1.1\")");
  }
  RecordingReporter::~RecordingReporter((RecordingReporter *)&results.m_failureCount);
  return;
}

Assistant:

TEST(CheckCloseFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    const float expected = 0.9f;
    const float actual = 1.1f;
    CheckClose(results, expected, actual, 0.01f, TestDetails("", "", "", 0));

	using namespace std;
    CHECK(strstr(reporter.lastFailedMessage, "xpected 0.9"));
    CHECK(strstr(reporter.lastFailedMessage, "was 1.1"));
}